

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk_file_transfer.cpp
# Opt level: O3

TonkFile tonk_file_from_buffer
                   (TonkConnection connection,uint32_t channel,char *name,void *data,uint32_t bytes,
                   uint32_t flags)

{
  TonkFile pTVar1;
  uint8_t **this;
  TonkFile this_00;
  undefined1 uVar2;
  TonkFile pTVar3;
  char *pcVar4;
  undefined1 *puVar5;
  
  if ((data != (void *)0x0 && (name != (char *)0x0 && connection != (TonkConnection)0x0)) &&
     (pTVar3 = (TonkFile)operator_new(0xd8,(nothrow_t *)&std::nothrow), pTVar3 != (TonkFile)0x0)) {
    pTVar1 = pTVar3 + 1;
    pTVar3->Flags = 0;
    this = &pTVar3[1].OutputData;
    pTVar3->ProgressBytes = 0;
    pTVar3->TotalBytes = 0;
    pTVar3->Name = (char *)0x0;
    pTVar3->OutputData = (uint8_t *)0x0;
    pTVar3->OutputFileName = (char *)0x0;
    pTVar3[1].ProgressBytes = (uint64_t)&pTVar3[1].Flags;
    pTVar3[1].TotalBytes = 0;
    *(undefined1 *)&pTVar3[1].Flags = 0;
    cat::MappedFile::MappedFile((MappedFile *)this);
    this_00 = pTVar3 + 2;
    cat::MappedView::MappedView((MappedView *)this_00);
    uVar2 = 0;
    *(undefined4 *)&pTVar3[2].OutputFileName = 0;
    *(undefined1 *)((long)&pTVar3[2].OutputFileName + 4) = 0;
    *(undefined4 *)&pTVar3[3].ProgressBytes = 0;
    pTVar3[3].TotalBytes = (uint64_t)&pTVar3[3].Name;
    *(undefined8 *)&pTVar3[3].Flags = 0;
    *(undefined1 *)&pTVar3[3].Name = 0;
    *(undefined8 *)((long)&pTVar3[4].ProgressBytes + 5) = 0;
    *(undefined8 *)((long)&pTVar3[4].TotalBytes + 5) = 0;
    pTVar3[3].OutputFileName = (char *)0x0;
    pTVar3[4].ProgressBytes = 0;
    pTVar3[4].Flags = channel;
    if ((channel - 0x32 < 6) || (uVar2 = 1, channel - 0x96 < 6)) {
      pTVar3[4].field_0x14 = uVar2;
      pTVar3[4].TotalBytes = (uint64_t)connection;
      pcVar4 = (char *)pTVar3[1].TotalBytes;
      strlen(name);
      std::__cxx11::string::_M_replace((ulong)pTVar1,0,pcVar4,(ulong)name);
      pTVar3->Name = (char *)pTVar3[1].ProgressBytes;
      if ((flags & 1) != 0) {
        pTVar3[3].OutputFileName = (char *)data;
LAB_00133303:
        pTVar3->TotalBytes = (ulong)bytes;
        return pTVar3;
      }
      pcVar4 = (char *)operator_new__((ulong)bytes,(nothrow_t *)&std::nothrow);
      pTVar3[4].ProgressBytes = (uint64_t)pcVar4;
      if (pcVar4 != (char *)0x0) {
        memcpy(pcVar4,data,(ulong)bytes);
        pTVar3[3].OutputFileName = pcVar4;
        goto LAB_00133303;
      }
      if ((char **)pTVar3[3].TotalBytes != &pTVar3[3].Name) {
        operator_delete((undefined1 *)pTVar3[3].TotalBytes);
      }
      cat::MappedView::~MappedView((MappedView *)this_00);
      cat::MappedFile::~MappedFile((MappedFile *)this);
      puVar5 = (undefined1 *)pTVar1->ProgressBytes;
    }
    else {
      cat::MappedView::~MappedView((MappedView *)this_00);
      cat::MappedFile::~MappedFile((MappedFile *)this);
      puVar5 = (undefined1 *)pTVar1->ProgressBytes;
    }
    if ((uint32_t *)puVar5 != &pTVar3[1].Flags) {
      operator_delete(puVar5);
    }
    operator_delete(pTVar3);
  }
  return (TonkFile)0x0;
}

Assistant:

TONK_EXPORT TonkFile tonk_file_from_buffer(
    TonkConnection connection,  ///< Connection to send on
    uint32_t          channel,  ///< Reliable channel for data
    const char*          name,  ///< Transfer name
    const void*          data,  ///< File buffer data pointer
    uint32_t            bytes,  ///< File buffer bytes to send
    uint32_t            flags   ///< Flags for buffer
)
{
    // Input validation
    if (!connection || !name || !data) {
        TONK_DEBUG_BREAK();
        return nullptr;
    }

    TonkFileTransfer* transfer = new (std::nothrow) TonkFileTransfer;

    if (!transfer) {
        return nullptr; // OOM
    }

    // Input validation
    if (!transfer->SetChannel(channel)) {
        delete transfer;
        return nullptr;
    }

    transfer->Connection = connection;
    transfer->NameStr = name;
    transfer->Name = transfer->NameStr.c_str();

    if (flags & TONK_FILE_BUFFER_ZERO_COPY) {
        transfer->AppDataPtr = reinterpret_cast<const uint8_t*>(data);
    }
    else {
        transfer->InternalDataCopy = new (std::nothrow) uint8_t[bytes];

        if (!transfer->InternalDataCopy) {
            delete transfer;
            return nullptr; // OOM
        }

        // Make a copy of the app data
        memcpy(transfer->InternalDataCopy, data, bytes);
        transfer->AppDataPtr = transfer->InternalDataCopy;
    }
    transfer->TotalBytes = bytes;

    return reinterpret_cast<TonkFile>(transfer);
}